

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

Value * __thiscall
GlobOptBlockData::MergeValues
          (GlobOptBlockData *this,Value *toDataValue,Value *fromDataValue,Sym *fromDataSym,
          bool isLoopBackEdge,bool forceUniqueValue,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  uint uVar1;
  GlobOpt *pGVar2;
  code *pcVar3;
  Value *valueInfo;
  bool bVar4;
  ValueNumber VVar5;
  ValueNumber VVar6;
  uint *puVar7;
  ValueInfo *pVVar8;
  ValueInfo *pVVar9;
  Value **ppVVar10;
  undefined4 *puVar11;
  Sym *pSVar12;
  Sym *pSVar13;
  ValueNumber local_ac;
  Value *local_68;
  GlobOptBlockData *local_60;
  Value *newValue;
  ValueInfo *newValueInfo;
  ValueNumber local_48;
  ValueNumber VStack_44;
  bool sameValueNumber;
  undefined1 local_40 [8];
  ValueNumberPair sourceValueNumberPair;
  bool forceUniqueValue_local;
  bool isLoopBackEdge_local;
  Sym *fromDataSym_local;
  Value *fromDataValue_local;
  Value *toDataValue_local;
  GlobOptBlockData *this_local;
  
  this_local = (GlobOptBlockData *)toDataValue;
  if (toDataValue != fromDataValue) {
    sourceValueNumberPair.second._2_1_ = forceUniqueValue;
    sourceValueNumberPair.second._3_1_ = isLoopBackEdge;
    unique0x1000031a = fromDataSym;
    VStack_44 = ::Value::GetValueNumber(toDataValue);
    local_48 = ::Value::GetValueNumber(fromDataValue);
    JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::Pair
              ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_40,
               &stack0xffffffffffffffbc,&local_48);
    puVar7 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::First
                       ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_40);
    uVar1 = *puVar7;
    puVar7 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::Second
                       ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_40);
    newValueInfo._7_1_ = uVar1 == *puVar7;
    pVVar8 = MergeValueInfo(this,toDataValue,fromDataValue,stack0xffffffffffffffd0,
                            (bool)(sourceValueNumberPair.second._3_1_ & 1),(bool)newValueInfo._7_1_,
                            symsRequiringCompensation,symsCreatedForMerge);
    if (pVVar8 == (ValueInfo *)0x0) {
      this_local = (GlobOptBlockData *)0x0;
    }
    else {
      newValue = (Value *)pVVar8;
      if (((newValueInfo._7_1_ & 1) == 0) ||
         (pVVar9 = ::Value::GetValueInfo(toDataValue), pVVar8 != pVVar9)) {
        local_60 = (GlobOptBlockData *)0x0;
        if ((sourceValueNumberPair.second._2_1_ & 1) == 0) {
          local_68 = (Value *)0x0;
          ppVVar10 = JsUtil::
                     BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ::Lookup(this->globOpt->valuesCreatedForMerge,
                              (Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_40,
                              &local_68);
          local_60 = (GlobOptBlockData *)*ppVVar10;
          if (local_60 == (GlobOptBlockData *)0x0) {
            pGVar2 = this->globOpt;
            if ((newValueInfo._7_1_ & 1) == 0) {
              local_ac = GlobOpt::NewValueNumber(this->globOpt);
            }
            else {
              puVar7 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::First
                                 ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_40);
              local_ac = *puVar7;
            }
            local_60 = (GlobOptBlockData *)GlobOpt::NewValue(pGVar2,local_ac,(ValueInfo *)newValue);
            JsUtil::
            BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Add(this->globOpt->valuesCreatedForMerge,
                  (Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_40,(Value **)&local_60)
            ;
          }
          else {
            bVar4 = (bool)(newValueInfo._7_1_ & 1);
            VVar5 = ::Value::GetValueNumber((Value *)local_60);
            VVar6 = ::Value::GetValueNumber(toDataValue);
            if (bVar4 != (VVar5 == VVar6)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                 ,0x38b,
                                 "(sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber()))"
                                 ,
                                 "sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber())"
                                );
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar11 = 0;
            }
            ::Value::SetValueInfo((Value *)local_60,(ValueInfo *)newValue);
          }
        }
        else {
          local_60 = (GlobOptBlockData *)GlobOpt::NewValue(this->globOpt,(ValueInfo *)newValue);
        }
        pVVar8 = ::Value::GetValueInfo(toDataValue);
        pSVar12 = ValueInfo::GetSymStore(pVVar8);
        pVVar8 = ::Value::GetValueInfo(fromDataValue);
        pSVar13 = ValueInfo::GetSymStore(pVVar8);
        valueInfo = newValue;
        if (pSVar12 == pSVar13) {
          pGVar2 = this->globOpt;
          pVVar8 = ::Value::GetValueInfo(toDataValue);
          pSVar12 = ValueInfo::GetSymStore(pVVar8);
          GlobOpt::SetSymStoreDirect(pGVar2,(ValueInfo *)valueInfo,pSVar12);
        }
        this_local = local_60;
      }
    }
  }
  return (Value *)this_local;
}

Assistant:

Value *
GlobOptBlockData::MergeValues(
    Value *toDataValue,
    Value *fromDataValue,
    Sym *fromDataSym,
    bool isLoopBackEdge,
    bool forceUniqueValue,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    // Same map
    if (toDataValue == fromDataValue)
    {
        return toDataValue;
    }

    const ValueNumberPair sourceValueNumberPair(toDataValue->GetValueNumber(), fromDataValue->GetValueNumber());
    const bool sameValueNumber = sourceValueNumberPair.First() == sourceValueNumberPair.Second();

    ValueInfo *newValueInfo =
        this->MergeValueInfo(
            toDataValue,
            fromDataValue,
            fromDataSym,
            isLoopBackEdge,
            sameValueNumber,
            symsRequiringCompensation,
            symsCreatedForMerge);

    if (newValueInfo == nullptr)
    {
        return nullptr;
    }

    if (sameValueNumber && newValueInfo == toDataValue->GetValueInfo())
    {
        return toDataValue;
    }

    Value *newValue = nullptr;
    if (forceUniqueValue)
    {
        newValue = this->globOpt->NewValue(newValueInfo);
    }
    else
    {
        // There may be other syms in toData that haven't been merged yet, referring to the current toData value for this sym. If
        // the merge produced a new value info, don't corrupt the value info for the other sym by changing the same value. Instead,
        // create one value per source value number pair per merge and reuse that for new value infos.
        newValue = this->globOpt->valuesCreatedForMerge->Lookup(sourceValueNumberPair, nullptr);
        if (newValue)
        {
            Assert(sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber()));

            // This is an exception where Value::SetValueInfo is called directly instead of GlobOpt::ChangeValueInfo, because we're
            // actually generating new value info through merges.
            newValue->SetValueInfo(newValueInfo);
        }
        else
        {
            newValue = this->globOpt->NewValue(sameValueNumber ? sourceValueNumberPair.First() : this->globOpt->NewValueNumber(), newValueInfo);
            this->globOpt->valuesCreatedForMerge->Add(sourceValueNumberPair, newValue);
        }
    }

    // Set symStore if same on both paths.
    if (toDataValue->GetValueInfo()->GetSymStore() == fromDataValue->GetValueInfo()->GetSymStore())
    {
        this->globOpt->SetSymStoreDirect(newValueInfo, toDataValue->GetValueInfo()->GetSymStore());
    }

    return newValue;
}